

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QDnsTlsAssociationRecord>::emplace<QDnsTlsAssociationRecord>
          (QMovableArrayOps<QDnsTlsAssociationRecord> *this,qsizetype i,
          QDnsTlsAssociationRecord *args)

{
  QDnsTlsAssociationRecord **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QDnsTlsAssociationRecord *pQVar5;
  QDnsTlsAssociationRecordPrivate *pQVar6;
  QDnsTlsAssociationRecord QVar7;
  long in_FS_OFFSET;
  bool bVar8;
  QDnsTlsAssociationRecord tmp;
  Inserter local_58;
  QDnsTlsAssociationRecord local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
           super_QArrayDataPointer<QDnsTlsAssociationRecord>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_002395a9:
    local_30 = (QDnsTlsAssociationRecord)(args->d).d.ptr;
    (args->d).d.ptr = (QDnsTlsAssociationRecordPrivate *)0x0;
    bVar8 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
            super_QArrayDataPointer<QDnsTlsAssociationRecord>.size != 0;
    QArrayDataPointer<QDnsTlsAssociationRecord>::detachAndGrow
              ((QArrayDataPointer<QDnsTlsAssociationRecord> *)this,(uint)(i == 0 && bVar8),1,
               (QDnsTlsAssociationRecord **)0x0,(QArrayDataPointer<QDnsTlsAssociationRecord> *)0x0);
    QVar7.d.d.ptr = local_30.d.d.ptr;
    if (i == 0 && bVar8) {
      local_30.d.d.ptr =
           (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
           (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0;
      (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
      super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr[-1].d.d.ptr =
           (QDnsTlsAssociationRecordPrivate *)QVar7.d.d.ptr;
      ppQVar1 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                 super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                super_QArrayDataPointer<QDnsTlsAssociationRecord>.size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_58.displaceTo =
           (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
           super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
      local_58.displaceFrom = local_58.displaceTo + i;
      local_58.displaceTo = local_58.displaceTo + i + 1;
      local_58.nInserts = 1;
      local_58.bytes =
           ((this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
            super_QArrayDataPointer<QDnsTlsAssociationRecord>.size - i) * 8;
      local_58.data = (QArrayDataPointer<QDnsTlsAssociationRecord> *)this;
      memmove(local_58.displaceTo,local_58.displaceFrom,local_58.bytes);
      QVar7.d.d.ptr = local_30.d.d.ptr;
      local_30.d.d.ptr =
           (QExplicitlySharedDataPointer<QDnsTlsAssociationRecordPrivate>)
           (totally_ordered_wrapper<QDnsTlsAssociationRecordPrivate_*>)0x0;
      ((local_58.displaceFrom)->d).d.ptr = (QDnsTlsAssociationRecordPrivate *)QVar7.d.d.ptr;
      local_58.displaceFrom = local_58.displaceFrom + 1;
      Inserter::~Inserter(&local_58);
    }
    QDnsTlsAssociationRecord::~QDnsTlsAssociationRecord(&local_30);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
            super_QArrayDataPointer<QDnsTlsAssociationRecord>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                      super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      pQVar5 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
               super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
      pQVar6 = (args->d).d.ptr;
      (args->d).d.ptr = (QDnsTlsAssociationRecordPrivate *)0x0;
      pQVar5[lVar4].d.d.ptr = pQVar6;
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QDnsTlsAssociationRecord *)
          ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
          super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr)) goto LAB_002395a9;
      pQVar5 = (this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
               super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
      pQVar6 = (args->d).d.ptr;
      (args->d).d.ptr = (QDnsTlsAssociationRecordPrivate *)0x0;
      pQVar5[-1].d.d.ptr = pQVar6;
      ppQVar1 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
                 super_QArrayDataPointer<QDnsTlsAssociationRecord>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QDnsTlsAssociationRecord>).
              super_QArrayDataPointer<QDnsTlsAssociationRecord>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }